

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_model.cpp
# Opt level: O2

void __thiscall ICACHE::ICACHE(ICACHE *this,CPU *cpu_pointer,BUS *bus_pointer)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint8_t *__s;
  uint *__s_00;
  CACHE *__s_01;
  CACHE *this_00;
  
  (this->super_CACHE).cpu = cpu_pointer;
  (this->super_CACHE).bus_p = bus_pointer;
  (this->super_CACHE).enabled = 0;
  (this->super_CACHE).nways = 1;
  (this->super_CACHE).nsets = 0x200;
  (this->super_CACHE).blocksize = 0x10;
  (this->super_CACHE).ustates = 2;
  (this->super_CACHE).missdelay = 1;
  (this->super_CACHE).hitdelay = 1;
  (this->super_CACHE).tags = (oraddr_t *)0x0;
  (this->super_CACHE).mem = (uint8_t *)0x0;
  (this->super_CACHE).lrus = (uint *)0x0;
  __s = (uint8_t *)operator_new__(0x2000);
  memset(__s,0,0x2000);
  (this->super_CACHE).mem = __s;
  __s_00 = (uint *)operator_new__(0x800);
  memset(__s_00,0,0x800);
  (this->super_CACHE).lrus = __s_00;
  __s_01 = (CACHE *)operator_new__(0x800);
  this_00 = __s_01;
  memset(__s_01,0,0x800);
  (this->super_CACHE).tags = (oraddr_t *)__s_01;
  uVar1 = CACHE::log2_int(this_00,0x10);
  (this->super_CACHE).blocksize_log2 = uVar1;
  (this->super_CACHE).set_mask = 0x1ff << ((byte)uVar1 & 0x1f);
  (this->super_CACHE).tagaddr_mask = 0xffffe000;
  (this->super_CACHE).last_way = 0x200;
  (this->super_CACHE).block_offset_mask = 0xf;
  (this->super_CACHE).block_mask = 0xfffffff0;
  (this->super_CACHE).ustates_reload = 1;
  *(byte *)(cpu_pointer->sprs + 1) = (byte)cpu_pointer->sprs[1] & 0xfb;
  iVar2 = CACHE::log2_int(this_00,(ulong)(this->super_CACHE).nsets);
  uVar1 = cpu_pointer->sprs[6];
  cpu_pointer->sprs[6] = iVar2 << 3 | uVar1 & 0xffffff87;
  uVar3 = CACHE::log2_int(this_00,(ulong)(this->super_CACHE).nways);
  uVar3 = iVar2 << 3 | uVar1 & 0xffffff80 | uVar3;
  cpu_pointer->sprs[6] = uVar3;
  cpu_pointer->sprs[6] = (uint)((this->super_CACHE).blocksize != 0x10) << 7 | uVar3 & 0xffffff7f;
  return;
}

Assistant:

ICACHE::ICACHE(CPU * cpu_pointer, BUS *bus_pointer)
{
    int set_bits;
    int way_bits;
    unsigned int size = 0;

    cpu = cpu_pointer;
    bus_p = bus_pointer;
    enabled = 0;
    nsets = 512;
    nways = 1;
    blocksize = MIN_IC_BLOCK_SIZE;
    ustates = 2;
    hitdelay = 1;
    missdelay = 1;

    mem = NULL; /* Internal configuration */
    lrus = NULL;
    tags = NULL;

    size = nways * nsets * blocksize;
    if(size)
    {
        mem = new uint8_t[size]();
        lrus = new unsigned int[nsets*nways]();
        tags = new oraddr_t[nsets*nways]();

    }

    blocksize_log2 = log2_int(blocksize);
    set_mask = (nsets - 1) << blocksize_log2;
    tagaddr_mask = ~((nsets * blocksize) - 1);
    last_way = nsets * nways;
    block_offset_mask = blocksize - 1;
    block_mask = ~block_offset_mask;
    ustates_reload = ustates - 1;

    /* Set SPRs as appropriate */

    if (enabled)
    {
        cpu->sprs[SPR_UPR] |= SPR_UPR_ICP;
    }
    else
    {
        cpu->sprs[SPR_UPR] &= ~SPR_UPR_ICP;
    }

    set_bits = log2_int(nsets);
    cpu->sprs[SPR_ICCFGR] &= ~SPR_ICCFGR_NCS;
    cpu->sprs[SPR_ICCFGR] |= set_bits << SPR_ICCFGR_NCS_OFF;

    way_bits = log2_int(nways);
    cpu->sprs[SPR_ICCFGR] &= ~SPR_ICCFGR_NCW;
    cpu->sprs[SPR_ICCFGR] |= way_bits << SPR_ICCFGR_NCW_OFF;

    if (MIN_IC_BLOCK_SIZE == blocksize)
    {
        cpu->sprs[SPR_ICCFGR] &= ~SPR_ICCFGR_CBS;
    }
    else
    {
        cpu->sprs[SPR_ICCFGR] |= SPR_ICCFGR_CBS;
    }
}